

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

void __thiscall TTD::RuntimeContextInfo::RuntimeContextInfo(RuntimeContextInfo *this)

{
  RuntimeContextInfo *this_local;
  
  JsUtil::Queue<Js::RecyclableObject_*,_Memory::HeapAllocator>::Queue
            (&this->m_worklist,&Memory::HeapAllocator::Instance);
  UtilSupport::TTAutoString::TTAutoString(&this->m_nullString);
  JsUtil::
  BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->m_coreObjToPathMap,&Memory::HeapAllocator::Instance,0x404);
  JsUtil::
  BaseDictionary<Js::FunctionBody_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->m_coreBodyToPathMap,&Memory::HeapAllocator::Instance,0x200);
  JsUtil::
  BaseDictionary<Js::DebuggerScope_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->m_coreDbgScopeToPathMap,&Memory::HeapAllocator::Instance,0x200);
  JsUtil::
  List<Js::RecyclableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::List(&this->m_sortedObjectList,&Memory::HeapAllocator::Instance,0x404);
  JsUtil::
  List<Js::FunctionBody_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  List(&this->m_sortedFunctionBodyList,&Memory::HeapAllocator::Instance,0x200);
  JsUtil::
  List<Js::DebuggerScope_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  List(&this->m_sortedDbgScopeList,&Memory::HeapAllocator::Instance,0x200);
  return;
}

Assistant:

RuntimeContextInfo::RuntimeContextInfo()
        : m_worklist(&HeapAllocator::Instance), m_nullString(),
        m_coreObjToPathMap(&HeapAllocator::Instance, TTD_CORE_OBJECT_COUNT), m_coreBodyToPathMap(&HeapAllocator::Instance, TTD_CORE_FUNCTION_BODY_COUNT), m_coreDbgScopeToPathMap(&HeapAllocator::Instance, TTD_CORE_FUNCTION_BODY_COUNT),
        m_sortedObjectList(&HeapAllocator::Instance, TTD_CORE_OBJECT_COUNT), m_sortedFunctionBodyList(&HeapAllocator::Instance, TTD_CORE_FUNCTION_BODY_COUNT), m_sortedDbgScopeList(&HeapAllocator::Instance, TTD_CORE_FUNCTION_BODY_COUNT)
    {
        ;
    }